

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsItemFocused(void)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  
  IVar1 = GImGui->NavId;
  if ((((IVar1 != 0) && (GImGui->NavDisableHighlight == false)) &&
      (pIVar2 = GImGui->CurrentWindow, IVar1 == (pIVar2->DC).LastItemId)) &&
     ((IVar1 != pIVar2->ID || (pIVar2->WriteAccessed == false)))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsItemFocused()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (g.NavId == 0 || g.NavDisableHighlight || g.NavId != window->DC.LastItemId)
        return false;

    // Special handling for the dummy item after Begin() which represent the title bar or tab.
    // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
    if (window->DC.LastItemId == window->ID && window->WriteAccessed)
        return false;

    return true;
}